

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

bool boost::random::operator==
               (well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
                *lhs,well_engine<unsigned_int,_32UL,_16UL,_0UL,_13UL,_9UL,_5UL,_boost::random::detail::M3<_16>,_boost::random::detail::M3<_15>,_boost::random::detail::M3<11>,_boost::random::detail::M0,_boost::random::detail::M3<_2>,_boost::random::detail::M3<_18>,_boost::random::detail::M2<_28>,_boost::random::detail::M5<_5,_3661901092U>,_boost::random::detail::no_tempering>
                     *rhs)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 == 0x10) break;
    lVar1 = lVar2 + 1;
  } while (lhs->state_[(int)lhs->index_ + (int)lVar2 & 0xf] ==
           rhs->state_[(int)rhs->index_ + (int)lVar2 & 0xf]);
  return lVar2 == 0x10;
}

Assistant:

friend bool operator==(const well_engine& lhs, const well_engine& rhs)
    {
        for (std::size_t i = 0; i != state_size; ++i)
            if (lhs.compute(i) != rhs.compute(i))
                return false;

        return true;
    }